

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1Parser.cpp
# Opt level: O0

void __thiscall VC1SequenceHeader::setFPS(VC1SequenceHeader *this,double value)

{
  int iVar1;
  int iVar2;
  long lVar3;
  VodCoreException *pVVar4;
  int dr;
  ostringstream local_350 [8];
  ostringstream ss_1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream ss;
  int num_units_in_tick;
  int time_scale;
  int nr;
  double value_local;
  VC1SequenceHeader *this_local;
  
  if (0 < this->m_fpsFieldBitVal) {
    lVar3 = lround(value);
    iVar1 = (int)lVar3 * 1000;
    lVar3 = lround((double)iVar1 / value);
    iVar2 = (int)lVar3;
    if (((((iVar1 != 24000) && (iVar1 != 25000)) && (iVar1 != 30000)) &&
        ((iVar1 != 50000 && (iVar1 != 60000)))) || ((iVar2 != 1000 && (iVar2 != 0x3e9)))) {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      std::operator<<((ostream *)local_1a0,
                      "Can\'t overwrite stream fps. Non standard fps values not supported for VC-1 streams"
                     );
      pVVar4 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(pVVar4,0x15f,&local_1d0);
      __cxa_throw(pVVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    this->time_base_den = iVar1;
    this->time_base_num = iVar2;
    if (iVar1 == 24000) {
      num_units_in_tick = 1;
    }
    else if (iVar1 == 25000) {
      num_units_in_tick = 2;
    }
    else if (iVar1 == 30000) {
      num_units_in_tick = 3;
    }
    else if (iVar1 == 50000) {
      num_units_in_tick = 4;
    }
    else {
      if (iVar1 != 60000) {
        std::__cxx11::ostringstream::ostringstream(local_350);
        std::operator<<((ostream *)local_350,
                        "Can\'t overwrite stream fps. Non standard fps values not supported for VC-1 streams"
                       );
        pVVar4 = (VodCoreException *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        VodCoreException::VodCoreException(pVVar4,0x15f,(string *)&dr);
        __cxa_throw(pVVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      num_units_in_tick = 5;
    }
    iVar1 = 2;
    if (iVar2 == 1000) {
      iVar1 = 1;
    }
    VC1Unit::updateBits(&this->super_VC1Unit,this->m_fpsFieldBitVal,8,num_units_in_tick);
    VC1Unit::updateBits(&this->super_VC1Unit,this->m_fpsFieldBitVal + 8,4,iVar1);
  }
  return;
}

Assistant:

void VC1SequenceHeader::setFPS(const double value)
{
    // if (value < 25.0 && pulldown)
    //	value *= 1.25;

    if (m_fpsFieldBitVal > 0)
    {
        int nr;
        const int time_scale = lround(value) * 1000;
        const int num_units_in_tick = lround(time_scale / value);
        if ((time_scale == 24000 || time_scale == 25000 || time_scale == 30000 || time_scale == 50000 ||
             time_scale == 60000) &&
            (num_units_in_tick == 1000 || num_units_in_tick == 1001))
        {
            time_base_den = time_scale;
            time_base_num = num_units_in_tick;
        }
        else
            THROW(ERR_VC1_ERR_FPS, "Can't overwrite stream fps. Non standard fps values not supported for VC-1 streams")

        switch (time_scale)
        {
        case 24000:
            nr = 1;
            break;
        case 25000:
            nr = 2;
            break;
        case 30000:
            nr = 3;
            break;
        case 50000:
            nr = 4;
            break;
        case 60000:
            nr = 5;
            break;
        default:
            THROW(ERR_VC1_ERR_FPS, "Can't overwrite stream fps. Non standard fps values not supported for VC-1 streams")
        }
        const int dr = (num_units_in_tick == 1000) ? 1 : 2;

        updateBits(m_fpsFieldBitVal, 8, nr);
        updateBits(m_fpsFieldBitVal + 8, 4, dr);
    }
}